

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O0

void __thiscall WriteIncludesBase::acceptSpacer(WriteIncludesBase *this,DomSpacer *node)

{
  TreeWalker *in_RDI;
  long in_FS_OFFSET;
  DomCustomWidget *in_stack_00000010;
  QString *in_stack_00000018;
  WriteIncludesBase *in_stack_00000020;
  char16_t *str;
  DataPointer *in_stack_ffffffffffffff78;
  QArrayDataPointer<char16_t> *this_00;
  DomSpacer *spacer;
  DomSpacer local_38;
  
  local_38.m_property.d.size = *(long *)(in_FS_OFFSET + 0x28);
  spacer = &local_38;
  this_00 = (QArrayDataPointer<char16_t> *)0x0;
  QArrayDataPointer<char16_t>::QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)spacer,(Data *)0x0,L"QSpacerItem",0xb);
  QString::QString((QString *)this_00,in_stack_ffffffffffffff78);
  add(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  QString::~QString((QString *)0x197b7f);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  TreeWalker::acceptSpacer(in_RDI,spacer);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38.m_property.d.size) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::acceptSpacer(DomSpacer *node)
{
    add(QStringLiteral("QSpacerItem"));
    TreeWalker::acceptSpacer(node);
}